

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump_node
          (DG2Dot<dg::LLVMNode> *this,LLVMNode *node,int ind,char *prefix)

{
  DependenceGraph<dg::LLVMNode> *this_00;
  bool bVar1;
  ostream *poVar2;
  Value *pVVar3;
  size_t sVar4;
  size_type sVar5;
  reference ppLVar6;
  LLVMNode *pLVar7;
  char *in_RCX;
  int in_EDX;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_RSI;
  DG2Dot<dg::LLVMNode> *in_RDI;
  LLVMDependenceGraph *subgraph;
  iterator __end0;
  iterator __begin0;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *__range4;
  Indent Ind;
  uint32_t slice_id;
  uint bfsorder;
  uint dfsorder;
  bool err;
  ostream *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  _Self local_50;
  _Self local_48;
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  *local_40;
  Indent local_34;
  uint32_t local_30;
  uint local_2c;
  uint local_28;
  byte local_21;
  char *local_20;
  int local_14;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *local_10;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_28 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getDFSOrder(in_RSI);
  local_2c = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getDFSOrder(local_10);
  local_30 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getSlice(local_10);
  Indent::Indent(&local_34,local_14);
  poVar2 = debug::operator<<(in_stack_ffffffffffffff90,(Indent *)in_stack_ffffffffffffff88);
  poVar2 = std::operator<<(poVar2,"NODE");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
  std::operator<<(poVar2," [label=\"");
  if (local_20 != (char *)0x0) {
    poVar2 = std::operator<<((ostream *)&in_RDI->out,local_20);
    std::operator<<(poVar2," ");
  }
  pLVar7 = (LLVMNode *)&in_RDI->out;
  pVVar3 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getKey(local_10);
  (*(code *)**(undefined8 **)&((_Rep_type *)&in_RDI->_vptr_DG2Dot)->_M_impl)(in_RDI,pLVar7,pVVar3);
  bVar1 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::hasSubgraphs
                    ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)0x1ca2f2);
  if (bVar1) {
    in_stack_ffffffffffffff90 = std::operator<<((ostream *)&in_RDI->out,"\\nsubgraphs: ");
    sVar4 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::subgraphsNum
                      ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)0x1ca31f);
    std::ostream::operator<<(in_stack_ffffffffffffff90,sVar4);
  }
  if (local_28 != 0) {
    poVar2 = std::operator<<((ostream *)&in_RDI->out,"\\ndfs order: ");
    std::ostream::operator<<(poVar2,local_28);
  }
  if (local_2c != 0) {
    poVar2 = std::operator<<((ostream *)&in_RDI->out,"\\nbfs order: ");
    std::ostream::operator<<(poVar2,local_2c);
  }
  if (local_30 != 0) {
    poVar2 = std::operator<<((ostream *)&in_RDI->out,"\\nslice: ");
    std::ostream::operator<<(poVar2,local_30);
  }
  local_21 = (**(code **)(*(long *)&((_Rep_type *)&in_RDI->_vptr_DG2Dot)->_M_impl + 8))
                       (in_RDI,&in_RDI->out,local_10);
  local_21 = local_21 & 1;
  std::operator<<((ostream *)&in_RDI->out,"\" ");
  if ((local_21 & 1) == 0) {
    sVar5 = std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
            count((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *
                  )in_RDI,(key_type *)pLVar7);
    if (sVar5 == 0) {
      if (local_30 == 0) {
        std::operator<<((ostream *)&in_RDI->out,"style=filled fillcolor=white");
      }
      else {
        std::operator<<((ostream *)&in_RDI->out,"style=filled fillcolor=greenyellow");
      }
    }
    else {
      std::operator<<((ostream *)&in_RDI->out,"style=filled fillcolor=orange");
    }
  }
  else {
    std::operator<<((ostream *)&in_RDI->out,"style=filled fillcolor=red");
  }
  std::operator<<((ostream *)&in_RDI->out,"]\n");
  dump_parameters(in_RDI,pLVar7,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  bVar1 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::hasSubgraphs
                    ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)0x1ca4ab);
  if ((bVar1) && ((in_RDI->options & 0x400) != 0)) {
    local_40 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getSubgraphs(local_10);
    local_48._M_node =
         (_Base_ptr)
         std::
         set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
         ::begin((set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                  *)in_stack_ffffffffffffff88);
    local_50._M_node =
         (_Base_ptr)
         std::
         set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
         ::end((set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
                *)in_stack_ffffffffffffff88);
    while (bVar1 = std::operator!=(&local_48,&local_50), bVar1) {
      ppLVar6 = std::_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*>::operator*
                          ((_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*> *)0x1ca519);
      this_00 = (DependenceGraph<dg::LLVMNode> *)*ppLVar6;
      poVar2 = debug::operator<<(in_stack_ffffffffffffff90,(Indent *)in_stack_ffffffffffffff88);
      poVar2 = std::operator<<(poVar2,"NODE");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
      in_stack_ffffffffffffff88 = std::operator<<(poVar2," -> NODE");
      pLVar7 = DependenceGraph<dg::LLVMNode>::getEntry(this_00);
      poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff88,pLVar7);
      poVar2 = std::operator<<(poVar2," [label=\"call\"");
      poVar2 = std::operator<<(poVar2,"  lhead=cluster_");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this_00);
      std::operator<<(poVar2," penwidth=3 style=dashed]\n");
      std::_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*>::operator++
                ((_Rb_tree_const_iterator<dg::LLVMDependenceGraph_*> *)in_stack_ffffffffffffff90);
    }
  }
  return;
}

Assistant:

void dump_node(NodeT *node, int ind = 1, const char *prefix = nullptr) {
        bool err = false;
        unsigned int dfsorder = node->getDFSOrder();
        unsigned int bfsorder = node->getDFSOrder();
        uint32_t slice_id = node->getSlice();
        Indent Ind(ind);

        out << Ind << "NODE" << node << " [label=\"";

        if (prefix)
            out << prefix << " ";

        printKey(out, node->getKey());

        if (node->hasSubgraphs())
            out << "\\nsubgraphs: " << node->subgraphsNum();
        if (dfsorder != 0)
            out << "\\ndfs order: " << dfsorder;
        if (bfsorder != 0)
            out << "\\nbfs order: " << bfsorder;

        if (slice_id != 0)
            out << "\\nslice: " << slice_id;

        // check if the node is OK, and if not
        // highlight it
        err = checkNode(out, node);

        // end of label
        out << "\" ";

        if (err) {
            out << "style=filled fillcolor=red";
        } else if (criteria.count(node) > 0) {
            out << "style=filled fillcolor=orange";
        } else if (slice_id != 0)
            out << "style=filled fillcolor=greenyellow";
        else
            out << "style=filled fillcolor=white";

        out << "]\n";

        dump_parameters(node, ind);
        if (node->hasSubgraphs() && (options & PRINT_CALL)) {
            // add call-site to callee edges
            for (auto subgraph : node->getSubgraphs()) {
                out << Ind << "NODE" << node << " -> NODE"
                    << subgraph->getEntry() << " [label=\"call\""
                    << "  lhead=cluster_" << subgraph
                    << " penwidth=3 style=dashed]\n";
            }
        }
    }